

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask8_24(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  vpmovsxbd_avx(ZEXT416(0x30201000));
  vpmovsxbd_avx(ZEXT416(0x3c2c1c0c));
  uVar3 = in[0x11] << 8 | in[0x10];
  uVar1 = in[0x16];
  auVar5 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar3));
  vpmovsxbd_avx(ZEXT416(0x34241404));
  auVar6 = vpgatherdd_avx512vl(*in);
  uVar3 = in[0x13] << 0x18 | in[0x12] << 0x10 | uVar3;
  auVar7 = vpslld_avx(auVar6,0x18);
  uVar4 = in[0x15] << 8 | in[0x14];
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar4));
  auVar6 = vpslld_avx(auVar6,8);
  auVar5 = vpor_avx(auVar6,auVar5);
  vpmovsxbd_avx(ZEXT416(0x38281808));
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar3));
  uVar2 = in[0x17];
  auVar6 = vpslld_avx(auVar6,0x10);
  auVar5 = vpternlogd_avx512vl(auVar7,auVar6,auVar5,0xfe);
  *(undefined1 (*) [16])out = auVar5;
  out[4] = uVar3;
  out[5] = uVar2 << 0x18 | uVar1 << 0x10 | uVar4;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask8_24(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  ++in;

  return out;
}